

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O2

void __thiscall Refal2::CScanner::preprocessing(CScanner *this,char c)

{
  switch(this->preprocessingState) {
  case PS_Initial:
    preprocessingInitital(this,c);
    return;
  case PS_Plus:
    preprocessingPlus(this,c);
    return;
  case PS_PlusAfterLineFeed:
    preprocessingPlusAfterLineFeed(this,c);
    return;
  case PS_SingleLineComment:
    preprocessingSingleLineComment(this,c);
    return;
  case PS_MultilineComment:
    break;
  case PS_String:
    preprocessingString(this,c);
    return;
  case PS_StringAfterQuote:
    preprocessingStringAfterQuote(this,c);
    return;
  case PS_StringAfterBackslash:
    preprocessingStringAfterBackslash(this,c);
    return;
  case PS_StringOctalCodeOne:
    preprocessingStringOctalCodeOne(this,c);
    return;
  case PS_StringOctalCodeTwo:
    preprocessingStringOctalCodeTwo(this,c);
    return;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/cmc-msu-ai[P]refal/src/Scanner.cpp"
                  ,0xfb,"void Refal2::CScanner::preprocessing(char)");
  }
  if (c == '}') {
    this->preprocessingState = this->savedPreprocessingState;
  }
  return;
}

Assistant:

void CScanner::preprocessing( char c )
{
	switch( preprocessingState ) {
		case PS_Initial:
			preprocessingInitital( c );
			break;
		case PS_Plus:
			preprocessingPlus( c );
			break;
		case PS_PlusAfterLineFeed:
			preprocessingPlusAfterLineFeed( c );
			break;
		case PS_SingleLineComment:
			preprocessingSingleLineComment( c );
			break;
		case PS_MultilineComment:
			preprocessingMultilineComment( c );
			break;
		case PS_String:
			preprocessingString( c );
			break;
		case PS_StringAfterQuote:
			preprocessingStringAfterQuote( c );
			break;
		case PS_StringAfterBackslash:
			preprocessingStringAfterBackslash( c );
			break;
		case PS_StringOctalCodeOne:
			preprocessingStringOctalCodeOne( c );
			break;
		case PS_StringOctalCodeTwo:
			preprocessingStringOctalCodeTwo( c );
			break;
		default:
			assert( false );
			break;
	}
}